

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardIncludes.h
# Opt level: O0

void __thiscall
cmDocumentationEntry::cmDocumentationEntry(cmDocumentationEntry *this,char *n,char *b)

{
  char *b_local;
  char *n_local;
  cmDocumentationEntry *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->Brief);
  if (n != (char *)0x0) {
    std::__cxx11::string::operator=((string *)this,n);
  }
  if (b != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->Brief,b);
  }
  return;
}

Assistant:

cmDocumentationEntry(const char *n, const char *b)
  { if (n) this->Name = n; if (b) this->Brief = b; }